

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_helpers.hpp
# Opt level: O3

void duckdb::HistogramGenericFunctor::PrepareData
               (Vector *input,idx_t count,Vector *extra_state,UnifiedVectorFormat *result)

{
  CreateSortKeyHelpers::CreateSortKey(input,count,(OrderModifiers)0x302,extra_state);
  Vector::Flatten(input,count);
  Vector::Flatten(extra_state,count);
  FlatVector::VerifyFlatVector(extra_state);
  FlatVector::VerifyFlatVector(input);
  (extra_state->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
       (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
            (&(extra_state->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
             &(input->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
  (extra_state->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
       (input->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
  Vector::ToUnifiedFormat(extra_state,count,result);
  return;
}

Assistant:

static void PrepareData(Vector &input, idx_t count, Vector &extra_state, UnifiedVectorFormat &result) {
		OrderModifiers modifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST);
		CreateSortKeyHelpers::CreateSortKey(input, count, modifiers, extra_state);
		input.Flatten(count);
		extra_state.Flatten(count);
		FlatVector::Validity(extra_state).Initialize(FlatVector::Validity(input));
		extra_state.ToUnifiedFormat(count, result);
	}